

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_disp_matrix_orient(char *mesg,mat44 mat)

{
  int iVar1;
  int j;
  int i;
  int local_24;
  int local_20;
  int local_1c;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stderr);
  }
  nifti_mat44_to_orientation(&local_1c,&local_20,&local_24);
  iVar1 = -1;
  if (0 < local_24 && (0 < local_20 && 0 < local_1c)) {
    nifti_disp_matrix_orient_cold_1();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nifti_disp_matrix_orient( const char * mesg, mat44 mat )
{
   int i, j, k;

   if ( mesg ) fputs( mesg, stderr );  /* use stdout? */

   nifti_mat44_to_orientation( mat, &i,&j,&k );
   if ( i <= 0 || j <= 0 || k <= 0 ) return -1;

   /* so we have good codes */
   fprintf(stderr, "  i orientation = '%s'\n"
                   "  j orientation = '%s'\n"
                   "  k orientation = '%s'\n",
                   nifti_orientation_string(i),
                   nifti_orientation_string(j),
                   nifti_orientation_string(k) );
   return 0;
}